

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_leader.cpp
# Opt level: O0

void __thiscall ON_Leader::SetPoints3d(ON_Leader *this,int count,ON_3dPoint *points)

{
  bool bVar1;
  int local_34;
  undefined1 local_30 [4];
  int i;
  ON_2dPoint uv;
  ON_3dPoint *points_local;
  int count_local;
  ON_Leader *this_local;
  
  uv.y = (double)points;
  ON_SimpleArray<ON_2dPoint>::Empty(&(this->m_points).super_ON_SimpleArray<ON_2dPoint>);
  for (local_34 = 0; local_34 < count; local_34 = local_34 + 1) {
    bVar1 = ON_Plane::ClosestPointTo
                      (&(this->super_ON_Annotation).m_plane,
                       *(ON_3dPoint *)((long)uv.y + (long)local_34 * 0x18),(double *)local_30,&uv.x)
    ;
    if (bVar1) {
      ON_SimpleArray<ON_2dPoint>::Append
                (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,(ON_2dPoint *)local_30);
    }
  }
  if (this->m_curve != (ON_NurbsCurve *)0x0) {
    if (this->m_curve != (ON_NurbsCurve *)0x0) {
      (*(this->m_curve->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
    }
    this->m_curve = (ON_NurbsCurve *)0x0;
  }
  InvalidateTextPoint(this);
  return;
}

Assistant:

void ON_Leader::SetPoints3d(int count, const ON_3dPoint* points)
{
  m_points.Empty();
  ON_2dPoint uv;
  for (int i = 0; i < count; i++)
  {
    if(m_plane.ClosestPointTo(points[i], &uv.x, &uv.y))
      m_points.Append(uv);
  }
  if (nullptr != m_curve)
  {
    delete m_curve;
    m_curve = nullptr;
  }
  InvalidateTextPoint();
}